

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-binary-reader.cc
# Opt level: O0

void __thiscall BinaryReader_DisabledOpcodes_Test::TestBody(BinaryReader_DisabledOpcodes_Test *this)

{
  bool bVar1;
  size_type sVar2;
  reference pvVar3;
  char *pcVar4;
  Message *pMVar5;
  AssertHelper local_140;
  Message local_138;
  undefined8 local_130;
  undefined4 local_124;
  undefined1 local_120 [8];
  AssertionResult gtest_ar_1;
  string *message;
  Message local_100;
  Enum local_f4;
  undefined1 local_f0 [8];
  AssertionResult gtest_ar;
  undefined1 local_d8 [4];
  Result result;
  BinaryReaderError reader;
  size_t size;
  uint8_t data [27];
  undefined1 local_50 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> b;
  Opcode opcode;
  uint32_t i;
  ReadBinaryOptions options;
  BinaryReader_DisabledOpcodes_Test *this_local;
  
  wabt::ReadBinaryOptions::ReadBinaryOptions((ReadBinaryOptions *)&opcode);
  b.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = Unreachable;
  do {
    if (I64AtomicRmw32CmpxchgU <
        b.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._4_4_) {
      return;
    }
    wabt::Opcode::Opcode
              ((Opcode *)
               &b.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,
               b.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage._4_4_);
    bVar1 = wabt::Opcode::IsEnabled
                      ((Opcode *)
                       &b.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage,(Features *)&opcode);
    if (!bVar1) {
      wabt::Opcode::GetBytes
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_50,
                 (Opcode *)
                 &b.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_50);
      if (3 < sVar2) {
        __assert_fail("b.size() <= 3",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/test-binary-reader.cc"
                      ,0x34,"virtual void BinaryReader_DisabledOpcodes_Test::TestBody()");
      }
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_50,3);
      size._0_1_ = 0;
      size._1_1_ = 0x61;
      size._2_1_ = 0x73;
      size._3_1_ = 0x6d;
      size._4_1_ = 1;
      size._5_1_ = 0;
      size._6_1_ = 0;
      size._7_1_ = 0;
      builtin_memcpy(data,"\x01\x04\x01`",5);
      data[5] = '\0';
      data[6] = '\x03';
      data[7] = '\x02';
      data[8] = '\x01';
      data[9] = '\0';
      data[10] = '\n';
      data[0xb] = '\a';
      data[0xc] = '\x01';
      data[0xd] = '\x05';
      data[0xe] = '\0';
      pvVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_50,0);
      data[0xf] = *pvVar3;
      pvVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_50,1);
      data[0x10] = *pvVar3;
      pvVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_50,2);
      data[0x11] = *pvVar3;
      data[0x12] = '\v';
      reader.first_error.message.field_2._8_8_ = 0x1b;
      anon_unknown.dwarf_8a7c::BinaryReaderError::BinaryReaderError((BinaryReaderError *)local_d8);
      gtest_ar.message_.ptr_._4_4_ =
           wabt::ReadBinary(&size,0x1b,(BinaryReaderDelegate *)local_d8,(ReadBinaryOptions *)&opcode
                           );
      local_f4 = Error;
      testing::internal::EqHelper<false>::Compare<wabt::Result::Enum,wabt::Result>
                ((EqHelper<false> *)local_f0,"Result::Error","result",&local_f4,
                 (Result *)((long)&gtest_ar.message_.ptr_ + 4));
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f0);
      if (!bVar1) {
        testing::Message::Message(&local_100);
        pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_f0);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&message,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/test-binary-reader.cc"
                   ,0x43,pcVar4);
        testing::internal::AssertHelper::operator=((AssertHelper *)&message,&local_100);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&message);
        testing::Message::~Message(&local_100);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_f0);
      gtest_ar_1.message_.ptr_ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &reader.first_error.loc.field_1.field_0.last_column;
      local_124 = 0;
      local_130 = std::__cxx11::string::find((char *)gtest_ar_1.message_.ptr_,0x4e2101);
      testing::internal::EqHelper<true>::Compare<unsigned_int,unsigned_long>
                (local_120,"0u",(uint *)"message.find(\"unexpected opcode\")",
                 (unsigned_long *)&local_124,&local_130);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_120);
      if (!bVar1) {
        testing::Message::Message(&local_138);
        pMVar5 = testing::Message::operator<<(&local_138,(char (*) [20])"Got error message: ");
        pMVar5 = testing::Message::operator<<(pMVar5,gtest_ar_1.message_.ptr_);
        pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_120);
        testing::internal::AssertHelper::AssertHelper
                  (&local_140,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/test-binary-reader.cc"
                   ,0x48,pcVar4);
        testing::internal::AssertHelper::operator=(&local_140,pMVar5);
        testing::internal::AssertHelper::~AssertHelper(&local_140);
        testing::Message::~Message(&local_138);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_120);
      anon_unknown.dwarf_8a7c::BinaryReaderError::~BinaryReaderError((BinaryReaderError *)local_d8);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_50);
    }
    b.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ =
         b.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage._4_4_ + Nop;
  } while( true );
}

Assistant:

TEST(BinaryReader, DisabledOpcodes) {
  // Use the default features.
  ReadBinaryOptions options;

  // Loop through all opcodes.
  for (uint32_t i = 0; i < static_cast<uint32_t>(Opcode::Invalid); ++i) {
    Opcode opcode(static_cast<Opcode::Enum>(i));
    if (opcode.IsEnabled(options.features)) {
      continue;
    }

    // Use a shorter name to make the clang-formatted table below look nicer.
    std::vector<uint8_t> b = opcode.GetBytes();
    assert(b.size() <= 3);
    b.resize(3);

    uint8_t data[] = {
        0x00, 0x61, 0x73, 0x6d, 0x01, 0x00, 0x00, 0x00,  // magic + version
        0x01, 0x04, 0x01, 0x60, 0x00, 0x00,  // type section: 1 type, (func)
        0x03, 0x02, 0x01, 0x00,              // func section: 1 func, type 0
        0x0a, 0x07, 0x01, 0x05, 0x00,        // code section: 1 func, 0 locals
        b[0], b[1], b[2],  // The instruction, padded with zeroes
        0x0b,              // end
    };
    const size_t size = sizeof(data);

    BinaryReaderError reader;
    Result result = ReadBinary(data, size, &reader, options);
    EXPECT_EQ(Result::Error, result);

    // This relies on the binary reader checking whether the opcode is allowed
    // before reading any further data needed by the instruction.
    const std::string& message = reader.first_error.message;
    EXPECT_EQ(0u, message.find("unexpected opcode"))
        << "Got error message: " << message;
  }
}